

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompletionEngine::filter(QCompletionEngine *this,QStringList *parts)

{
  bool bVar1;
  long *plVar2;
  QIndexMapper *indices;
  qsizetype qVar3;
  QString *pQVar4;
  undefined4 uVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  int emi;
  int i;
  QAbstractItemModel *model;
  QString part;
  QModelIndex parent;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  QMatchData *in_stack_fffffffffffffe30;
  int local_1b4;
  QCompletionEngine *in_stack_fffffffffffffe70;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  long local_128;
  long local_120;
  long local_118;
  undefined1 local_f8 [96];
  undefined1 local_98 [40];
  int local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = (long *)QAbstractProxyModel::sourceModel();
  QList<QString>::operator=
            ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (QList<QString> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0xa6a086);
  if (bVar1) {
    in_stack_fffffffffffffe30 = (QMatchData *)(in_RDI + 0xe);
    QString::QString((QString *)0xa6a0a7);
    QList<QString>::append
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    QString::~QString((QString *)0xa6a0c6);
  }
  *(undefined4 *)(in_RDI + 0x14) = 0xffffffff;
  QModelIndex::QModelIndex((QModelIndex *)0xa6a0e2);
  in_RDI[0x11] = local_128;
  in_RDI[0x12] = local_120;
  in_RDI[0x13] = local_118;
  QMatchData::QMatchData
            ((QMatchData *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  QMatchData::operator=
            ((QMatchData *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (QMatchData *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  QMatchData::~QMatchData((QMatchData *)0xa6a144);
  filterHistory(in_stack_fffffffffffffe70);
  QMatchData::operator=
            ((QMatchData *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (QMatchData *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  QMatchData::~QMatchData((QMatchData *)0xa6a179);
  if (plVar2 != (long *)0x0) {
    local_140 = &DAT_aaaaaaaaaaaaaaaa;
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    local_130 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0xa6a1c0);
    local_1b4 = 0;
    while( true ) {
      indices = (QIndexMapper *)(long)local_1b4;
      qVar3 = QList<QString>::size((QList<QString> *)(in_RDI + 0xe));
      if (qVar3 + -1 <= (long)indices) break;
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      local_150 = &DAT_aaaaaaaaaaaaaaaa;
      local_148 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (QString *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      (**(code **)(*in_RDI + 0x18))(local_98,in_RDI,&local_158,&local_140,0xffffffff);
      in_stack_fffffffffffffe24 = local_70;
      QMatchData::~QMatchData((QMatchData *)0xa6a286);
      bVar1 = in_stack_fffffffffffffe24 != -1;
      if (bVar1) {
        (**(code **)(*plVar2 + 0x60))
                  (&local_170,plVar2,in_stack_fffffffffffffe24,*(undefined4 *)(in_RDI[0xd] + 0xc0),
                   &local_140);
        local_140 = local_170;
        local_138 = local_168;
        local_130 = local_160;
      }
      QString::~QString((QString *)0xa6a30c);
      if (!bVar1) goto LAB_00a6a467;
      local_1b4 = local_1b4 + 1;
    }
    in_RDI[0x11] = (long)local_140;
    in_RDI[0x12] = (long)local_138;
    in_RDI[0x13] = (long)local_130;
    QList<QString>::constLast
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    bVar1 = QString::isEmpty((QString *)0xa6a370);
    if (bVar1) {
      (**(code **)(*plVar2 + 0x78))(plVar2,in_RDI + 0x11);
      QIndexMapper::QIndexMapper
                ((QIndexMapper *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
      QMatchData::QMatchData
                (in_stack_fffffffffffffe30,indices,in_stack_fffffffffffffe24,
                 SUB41((uint)in_stack_fffffffffffffe20 >> 0x18,0));
      QMatchData::operator=
                ((QMatchData *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (QMatchData *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      QMatchData::~QMatchData((QMatchData *)0xa6a3da);
      QIndexMapper::~QIndexMapper((QIndexMapper *)0xa6a3e4);
    }
    else {
      pQVar4 = QList<QString>::constLast
                         ((QList<QString> *)
                          CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      (**(code **)(*in_RDI + 0x18))(local_f8,in_RDI,pQVar4,in_RDI + 0x11,1);
      QMatchData::operator=
                ((QMatchData *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (QMatchData *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      QMatchData::~QMatchData((QMatchData *)0xa6a43d);
    }
    bVar1 = QMatchData::isValid((QMatchData *)0xa6a44b);
    uVar5 = 0xffffffff;
    if (bVar1) {
      uVar5 = 0;
    }
    *(undefined4 *)(in_RDI + 0x14) = uVar5;
  }
LAB_00a6a467:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompletionEngine::filter(const QStringList& parts)
{
    const QAbstractItemModel *model = c->proxy->sourceModel();
    curParts = parts;
    if (curParts.isEmpty())
        curParts.append(QString());

    curRow = -1;
    curParent = QModelIndex();
    curMatch = QMatchData();
    historyMatch = filterHistory();

    if (!model)
        return;

    QModelIndex parent;
    for (int i = 0; i < curParts.size() - 1; i++) {
        QString part = curParts.at(i);
        int emi = filter(part, parent, -1).exactMatchIndex;
        if (emi == -1)
            return;
        parent = model->index(emi, c->column, parent);
    }

    // Note that we set the curParent to a valid parent, even if we have no matches
    // When filtering is disabled, we show all the items under this parent
    curParent = parent;
    if (curParts.constLast().isEmpty())
        curMatch = QMatchData(QIndexMapper(0, model->rowCount(curParent) - 1), -1, false);
    else
        curMatch = filter(curParts.constLast(), curParent, 1); // build at least one
    curRow = curMatch.isValid() ? 0 : -1;
}